

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuThread.cpp
# Opt level: O0

Value __thiscall xmrig::CpuThread::toJSON(CpuThread *this,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_00;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RSI;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RDI;
  Value VVar2;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Value *out;
  undefined4 in_stack_ffffffffffffffa8;
  Type in_stack_ffffffffffffffac;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  
  if (*(int *)((long)&in_RSI->data_ + 8) == 0) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(in_RDI,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    uVar1 = extraout_RDX;
  }
  else {
    this_00 = in_RDI;
    allocator_00 = rapidjson::
                   GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::GetAllocator(in_RDX);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(this_00,in_stack_ffffffffffffffac);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack<unsigned_int>(in_RSI,(uint)((ulong)in_RDX >> 0x20),allocator_00);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack<long>(in_RSI,(long)in_RDX,allocator_00);
    uVar1 = extraout_RDX_00;
  }
  VVar2.data_.s.str = (Ch *)uVar1;
  VVar2.data_.n = (Number)in_RDI;
  return (Value)VVar2.data_;
}

Assistant:

rapidjson::Value xmrig::CpuThread::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    if (m_intensity == 0) {
        return Value(m_affinity);
    }

    auto &allocator = doc.GetAllocator();

    Value out(kArrayType);
    out.PushBack(m_intensity, allocator);
    out.PushBack(m_affinity, allocator);

    return out;
}